

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O3

int __thiscall ncnn::InstanceNorm::load_model(InstanceNorm *this,ModelBin *mb)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  int iVar4;
  void *local_70;
  int *local_68;
  size_t local_60;
  int local_58;
  Allocator *local_50;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  size_t local_30;
  
  iVar4 = 0;
  if (this->affine != 0) {
    (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->channels,1);
    if (&this->gamma_data != (Mat *)&local_70) {
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + 1;
        UNLOCK();
      }
      piVar1 = (this->gamma_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = (this->gamma_data).data;
          pAVar3 = (this->gamma_data).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (*pAVar3->_vptr_Allocator[3])();
          }
        }
      }
      (this->gamma_data).data = local_70;
      (this->gamma_data).refcount = local_68;
      (this->gamma_data).elemsize = local_60;
      (this->gamma_data).elempack = local_58;
      (this->gamma_data).allocator = local_50;
      (this->gamma_data).dims = local_48;
      (this->gamma_data).w = iStack_44;
      (this->gamma_data).h = iStack_40;
      (this->gamma_data).d = iStack_3c;
      (this->gamma_data).c = local_38;
      (this->gamma_data).cstep = local_30;
    }
    if (local_68 != (int *)0x0) {
      LOCK();
      *local_68 = *local_68 + -1;
      UNLOCK();
      if (*local_68 == 0) {
        if (local_50 == (Allocator *)0x0) {
          if (local_70 != (void *)0x0) {
            free(local_70);
          }
        }
        else {
          (*local_50->_vptr_Allocator[3])();
        }
      }
    }
    if (((this->gamma_data).data != (void *)0x0) &&
       ((long)(this->gamma_data).c * (this->gamma_data).cstep != 0)) {
      (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->channels,1);
      if (&this->beta_data != (Mat *)&local_70) {
        if (local_68 != (int *)0x0) {
          LOCK();
          *local_68 = *local_68 + 1;
          UNLOCK();
        }
        piVar1 = (this->beta_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pvVar2 = (this->beta_data).data;
            pAVar3 = (this->beta_data).allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->beta_data).data = local_70;
        (this->beta_data).refcount = local_68;
        (this->beta_data).elemsize = local_60;
        (this->beta_data).elempack = local_58;
        (this->beta_data).allocator = local_50;
        (this->beta_data).dims = local_48;
        (this->beta_data).w = iStack_44;
        (this->beta_data).h = iStack_40;
        (this->beta_data).d = iStack_3c;
        (this->beta_data).c = local_38;
        (this->beta_data).cstep = local_30;
      }
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + -1;
        UNLOCK();
        if (*local_68 == 0) {
          if (local_50 == (Allocator *)0x0) {
            if (local_70 != (void *)0x0) {
              free(local_70);
            }
          }
          else {
            (*local_50->_vptr_Allocator[3])();
          }
        }
      }
      if (((this->beta_data).data != (void *)0x0) &&
         ((long)(this->beta_data).c * (this->beta_data).cstep != 0)) {
        return 0;
      }
    }
    iVar4 = -100;
  }
  return iVar4;
}

Assistant:

int InstanceNorm::load_model(const ModelBin& mb)
{
    if (affine == 0)
        return 0;

    gamma_data = mb.load(channels, 1);
    if (gamma_data.empty())
        return -100;

    beta_data = mb.load(channels, 1);
    if (beta_data.empty())
        return -100;

    return 0;
}